

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O1

node_type * __thiscall
Tree<NULLC::Range>::erase(Tree<NULLC::Range> *this,node_type *node,Range *key)

{
  node_type *y;
  void *pvVar1;
  SmallBlock<detail::node<NULLC::Range>_> *pSVar2;
  node<NULLC::Range> *pnVar3;
  int iVar4;
  MySmallBlock *freedBlock;
  node_type *pnVar5;
  MySmallBlock *pMVar6;
  node_type *pnVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  node<NULLC::Range> *pnVar11;
  
  if (node == (node_type *)0x0) {
    return (node_type *)0x0;
  }
  pnVar7 = node;
  if (key->end < (node->key).start) {
    pnVar5 = erase(this,node->left,key);
    node->left = pnVar5;
  }
  else if ((node->key).end < key->start) {
    pnVar11 = node->right;
LAB_0022f513:
    pnVar5 = erase(this,pnVar11,key);
    node->right = pnVar5;
  }
  else {
    pMVar6 = (MySmallBlock *)node->left;
    if (pMVar6 == (MySmallBlock *)0x0) {
LAB_0022f526:
      pMVar6 = (MySmallBlock *)node->right;
    }
    else {
      pnVar11 = node->right;
      pnVar3 = pnVar11;
      if (pnVar11 != (node<NULLC::Range> *)0x0) {
        do {
          key = &pnVar3->key;
          pnVar3 = ((node<NULLC::Range> *)key)->left;
        } while (((node<NULLC::Range> *)key)->left != (node<NULLC::Range> *)0x0);
        pvVar1 = (((node<NULLC::Range> *)key)->key).end;
        (node->key).start = (((node<NULLC::Range> *)key)->key).start;
        (node->key).end = pvVar1;
        goto LAB_0022f513;
      }
      if (pMVar6 == (MySmallBlock *)0x0) goto LAB_0022f526;
    }
    if (pMVar6 == (MySmallBlock *)0x0) {
      pnVar7 = (node_type *)0x0;
      pMVar6 = (MySmallBlock *)node;
    }
    else {
      node->height = *(int *)(pMVar6->data + 0x20);
      pSVar2 = pMVar6->next;
      pvVar1 = *(void **)((long)pMVar6 + 8);
      pnVar11 = *(node<NULLC::Range> **)(pMVar6->data + 0x18);
      node->left = *(node<NULLC::Range> **)(pMVar6->data + 0x10);
      node->right = pnVar11;
      (node->key).start = pSVar2;
      (node->key).end = pvVar1;
    }
    pMVar6->next = (this->pool).freeBlocks;
    (this->pool).freeBlocks = pMVar6;
    if (pMVar6 == (MySmallBlock *)this->root) {
      this->root = pnVar7;
    }
  }
  iVar9 = 0;
  if (pnVar7 == (node_type *)0x0) {
    return (node_type *)0x0;
  }
  pnVar5 = pnVar7->left;
  if (pnVar5 != (node_type *)0x0) {
    iVar9 = pnVar5->height;
  }
  y = pnVar7->right;
  iVar8 = 0;
  iVar4 = 0;
  if (y != (node_type *)0x0) {
    iVar4 = y->height;
  }
  if (iVar4 < iVar9) {
    iVar4 = iVar9;
  }
  pnVar7->height = iVar4 + 1;
  if (pnVar5 != (node_type *)0x0) {
    iVar8 = pnVar5->height;
  }
  if (y == (node_type *)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = y->height;
  }
  if (iVar8 - iVar9 < 2) goto LAB_0022f62a;
  if (pnVar5 != (node_type *)0x0) {
    iVar10 = 0;
    iVar4 = 0;
    if (pnVar5->left != (node<NULLC::Range> *)0x0) {
      iVar4 = pnVar5->left->height;
    }
    if (pnVar5->right != (node<NULLC::Range> *)0x0) {
      iVar10 = pnVar5->right->height;
    }
    if (iVar4 < iVar10) {
      if (pnVar5 != (node_type *)0x0) {
        iVar10 = 0;
        iVar4 = 0;
        if (pnVar5->left != (node<NULLC::Range> *)0x0) {
          iVar4 = pnVar5->left->height;
        }
        if (pnVar5->right != (node<NULLC::Range> *)0x0) {
          iVar10 = pnVar5->right->height;
        }
        if (iVar4 < iVar10) {
          pnVar5 = left_rotate(this,pnVar5);
          pnVar7->left = pnVar5;
          goto LAB_0022f618;
        }
      }
LAB_0022f62a:
      if (-2 < iVar8 - iVar9) {
        return pnVar7;
      }
      if (y != (node_type *)0x0) {
        iVar4 = 0;
        iVar9 = 0;
        if (y->left != (node<NULLC::Range> *)0x0) {
          iVar9 = y->left->height;
        }
        if (y->right != (node<NULLC::Range> *)0x0) {
          iVar4 = y->right->height;
        }
        if (iVar4 < iVar9) {
          if (y == (node_type *)0x0) {
            return pnVar7;
          }
          iVar4 = 0;
          iVar9 = 0;
          if (y->left != (node<NULLC::Range> *)0x0) {
            iVar9 = y->left->height;
          }
          if (y->right != (node<NULLC::Range> *)0x0) {
            iVar4 = y->right->height;
          }
          if (iVar9 <= iVar4) {
            return pnVar7;
          }
          pnVar5 = right_rotate(this,y);
          pnVar7->right = pnVar5;
        }
      }
      pnVar7 = left_rotate(this,pnVar7);
      return pnVar7;
    }
  }
LAB_0022f618:
  pnVar7 = right_rotate(this,pnVar7);
  return pnVar7;
}

Assistant:

node_type* erase(node_type* node, const T& key)
	{
		if(node == NULL)
			return node;

		if(key < node->key)
		{
			node->left = erase(node->left, key);
		}else if(key > node->key){
			node->right = erase(node->right, key);
		}else{
			if((node->left == NULL) || (node->right == NULL))
			{
				node_type *temp = node->left ? node->left : node->right;

				if(temp == NULL)
				{
					temp = node;
					node = NULL;
				}else{
					*node = *temp;
				}

				pool.Deallocate(temp);

				if(temp == root)
					root = node;
			}else{
				node_type* temp = node->right->min_tree();

				node->key = temp->key;

				node->right = erase(node->right, temp->key);
			}
		}

		if(node == NULL)
			return node;

		node->height = detail::max(get_height(node->left), get_height(node->right)) + 1;

		int balance = get_balance(node);

		if(balance > 1 && get_balance(node->left) >= 0)
			return right_rotate(node);

		if(balance > 1 && get_balance(node->left) < 0)
		{
			node->left =  left_rotate(node->left);
			return right_rotate(node);
		}

		if(balance < -1 && get_balance(node->right) <= 0)
			return left_rotate(node);

		if(balance < -1 && get_balance(node->right) > 0)
		{
			node->right = right_rotate(node->right);
			return left_rotate(node);
		}

		return node;
	}